

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetRootInfo(void *cvode_mem,int *rootsfound)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (cvode_mem == (void *)0x0) {
    iVar3 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetRootInfo","cvode_mem = NULL illegal.");
  }
  else {
    iVar3 = 0;
    uVar1 = (ulong)*(uint *)((long)cvode_mem + 0x578);
    if ((int)*(uint *)((long)cvode_mem + 0x578) < 1) {
      uVar1 = 0;
    }
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      rootsfound[uVar2] = *(int *)(*(long *)((long)cvode_mem + 0x580) + uVar2 * 4);
    }
  }
  return iVar3;
}

Assistant:

int CVodeGetRootInfo(void *cvode_mem, int *rootsfound)
{
  CVodeMem cv_mem;
  int i, nrt;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetRootInfo", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  nrt = cv_mem->cv_nrtfn;

  for (i=0; i<nrt; i++) rootsfound[i] = cv_mem->cv_iroots[i];

  return(CV_SUCCESS);
}